

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::allgather<long>(long *data,size_t size,long *out,comm *comm)

{
  datatype dt;
  datatype local_20;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::allgather_big<long>(data,size,out,comm);
    return;
  }
  local_20._vptr_datatype = (_func_int **)&PTR__datatype_0015b1e8;
  local_20.mpitype = (MPI_Datatype)&ompi_mpi_long;
  local_20.builtin = true;
  MPI_Allgather();
  datatype::~datatype(&local_20);
  return;
}

Assistant:

void allgather(const T* data, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        // use custom implementation for big data
        impl::allgather_big(data, size, out, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Allgather(const_cast<T*>(data), size, dt.type(), out, size, dt.type(), comm);
    }
}